

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint32 __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  byte bVar1;
  uint32 uVar2;
  byte *pbVar3;
  int in_ESI;
  CodedInputStream *in_RDI;
  pair<bool,_const_unsigned_char_*> pVar4;
  pair<bool,_const_unsigned_char_*> p;
  uint32 tag;
  int buf_size;
  int i;
  uint32 result;
  uint32 b;
  uint8 *ptr;
  uchar **in_stack_ffffffffffffff28;
  bool *in_stack_ffffffffffffff30;
  uint32 local_ac [21];
  int local_58;
  int local_54;
  uint32 local_44;
  undefined1 local_3e;
  undefined1 local_3d;
  int local_3c;
  uint32 local_38;
  uint local_34;
  byte *local_30;
  uint32 *local_28;
  uint8 *local_20;
  int local_14;
  byte local_10;
  uchar *local_8;
  
  local_54 = in_ESI;
  local_58 = BufferSize(in_RDI);
  if ((local_58 < 10) && ((local_58 < 1 || ((in_RDI->buffer_end_[-1] & 0x80) != 0)))) {
    if ((local_58 == 0) &&
       (((0 < in_RDI->buffer_size_after_limit_ ||
         (in_RDI->total_bytes_read_ == in_RDI->current_limit_)) &&
        (in_RDI->total_bytes_read_ - in_RDI->buffer_size_after_limit_ < in_RDI->total_bytes_limit_))
       )) {
      in_RDI->legitimate_message_end_ = true;
      return 0;
    }
    uVar2 = ReadTagSlow(in_RDI);
    return uVar2;
  }
  if (local_54 == 0) {
    in_RDI->buffer_ = in_RDI->buffer_ + 1;
    return 0;
  }
  local_20 = in_RDI->buffer_;
  local_14 = local_54;
  local_28 = local_ac;
  local_30 = local_20 + 2;
  local_34 = (uint)local_20[1];
  local_38 = local_34 * 0x80 + local_54 + -0x80;
  if ((local_20[1] & 0x80) != 0) {
    bVar1 = *local_30;
    local_34 = (uint)bVar1;
    local_38 = local_34 * 0x4000 + (local_38 - 0x4000);
    local_30 = local_20 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_20[3];
      local_34 = (uint)bVar1;
      local_38 = local_34 * 0x200000 + (local_38 - 0x200000);
      local_30 = local_20 + 4;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = local_20[4];
        local_34 = (uint)bVar1;
        local_38 = local_34 * 0x10000000 + local_38 + 0xf0000000;
        local_30 = local_20 + 5;
        if ((bVar1 & 0x80) != 0) {
          for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
            pbVar3 = local_30 + 1;
            bVar1 = *local_30;
            local_34 = (uint)bVar1;
            local_30 = pbVar3;
            if ((bVar1 & 0x80) == 0) goto LAB_0049a2f2;
          }
          local_3d = 0;
          pVar4 = std::make_pair<bool,unsigned_char_const*&>
                            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          local_8 = pVar4.second;
          local_10 = pVar4.first;
          goto LAB_0049a32f;
        }
      }
    }
  }
LAB_0049a2f2:
  local_ac[0] = local_38;
  local_3e = 1;
  pVar4 = std::make_pair<bool,unsigned_char_const*&>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_8 = pVar4.second;
  local_10 = pVar4.first;
LAB_0049a32f:
  if ((local_10 & 1) == 0) {
    local_44 = 0;
  }
  else {
    in_RDI->buffer_ = local_8;
    local_44 = local_ac[0];
  }
  return local_44;
}

Assistant:

uint32 CodedInputStream::ReadTagFallback(uint32 first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32 tag;
    ::std::pair<bool, const uint8*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}